

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::CopyImageToBuffer
          (VulkanCommandBuffer *this,VkImage srcImage,VkImageLayout srcImageLayout,
          VkBuffer dstBuffer,uint32_t regionCount,VkBufferImageCopy *pRegions)

{
  Char *Message;
  undefined1 local_58 [8];
  string msg;
  VkBufferImageCopy *pRegions_local;
  uint32_t regionCount_local;
  VkBuffer dstBuffer_local;
  VkImageLayout srcImageLayout_local;
  VkImage srcImage_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = pRegions;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])dstBuffer);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"CopyImageToBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x228);
    std::__cxx11::string::~string((string *)local_58);
  }
  EndRenderScope(this);
  FlushBarriers(this);
  (*vkCmdCopyImageToBuffer)
            (this->m_VkCmdBuffer,srcImage,srcImageLayout,dstBuffer,regionCount,
             (VkBufferImageCopy *)msg.field_2._8_8_);
  return;
}

Assistant:

__forceinline void CopyImageToBuffer(VkImage                  srcImage,
                                         VkImageLayout            srcImageLayout,
                                         VkBuffer                 dstBuffer,
                                         uint32_t                 regionCount,
                                         const VkBufferImageCopy* pRegions)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        // Copy operations must be performed outside of render pass.
        EndRenderScope();
        FlushBarriers();
        vkCmdCopyImageToBuffer(m_VkCmdBuffer, srcImage, srcImageLayout, dstBuffer, regionCount, pRegions);
    }